

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Networking.h
# Opt level: O2

int uS::TLS::Context::passwordCallback(char *buf,int size,int rwflag,void *u)

{
  if (*(int *)((long)u + 8) < size) {
    size = *(int *)((long)u + 8);
  }
  memcpy(buf,*u,(long)size);
  buf[size] = '\0';
  return size;
}

Assistant:

static int passwordCallback(char *buf, int size, int rwflag, void *u)
    {
        std::string *password = (std::string *) u;
        int length = std::min<int>(size, password->length());
        memcpy(buf, password->data(), length);
        buf[length] = '\0';
        return length;
    }